

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExemptionDatabase.cpp
# Opt level: O0

void __thiscall
RenX::ExemptionDatabase::process_data
          (ExemptionDatabase *this,DataBuffer *buffer,FILE *file,fpos_t pos)

{
  uchar uVar1;
  uint uVar2;
  pointer pEVar3;
  unsigned_long uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long local_78;
  rep local_70;
  unsigned_long local_68;
  duration<long,_std::ratio<1L,_1L>_> local_60;
  duration local_58;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50 [3];
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  local_38;
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  entry;
  FILE *file_local;
  DataBuffer *buffer_local;
  ExemptionDatabase *this_local;
  fpos_t pos_local;
  
  entry._M_t.
  super___uniq_ptr_impl<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  ._M_t.
  super__Tuple_impl<0UL,_RenX::ExemptionDatabase::Entry_*,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
  .super__Head_base<0UL,_RenX::ExemptionDatabase::Entry_*,_false>._M_head_impl =
       (__uniq_ptr_data<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>,_true,_true>
        )(__uniq_ptr_data<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>,_true,_true>
          )file;
  std::make_unique<RenX::ExemptionDatabase::Entry>();
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  (pEVar3->pos).__pos = pos.__pos;
  (pEVar3->pos).__state = pos.__state;
  uVar1 = Jupiter::DataBuffer::pop<unsigned_char>(buffer);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  pEVar3->flags = uVar1;
  local_68 = Jupiter::DataBuffer::pop<unsigned_long>(buffer);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_60,&local_68);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_58,&local_60);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(local_50,&local_58);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  (pEVar3->timestamp).__d.__r = (rep)local_50[0].__d.__r;
  local_78 = Jupiter::DataBuffer::pop<long>(buffer);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_70,&local_78);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  (pEVar3->length).__r = local_70;
  uVar4 = Jupiter::DataBuffer::pop<unsigned_long>(buffer);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  pEVar3->steamid = uVar4;
  uVar2 = Jupiter::DataBuffer::pop<unsigned_int>(buffer);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  pEVar3->ip = uVar2;
  uVar1 = Jupiter::DataBuffer::pop<unsigned_char>(buffer);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  pEVar3->prefix_length = uVar1;
  Jupiter::DataBuffer::pop<std::__cxx11::string>(&local_98,buffer);
  pEVar3 = std::
           unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>
           ::operator->(&local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pEVar3->setter,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::
  vector<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>_>_>
  ::push_back(&this->m_entries,&local_38);
  std::
  unique_ptr<RenX::ExemptionDatabase::Entry,_std::default_delete<RenX::ExemptionDatabase::Entry>_>::
  ~unique_ptr(&local_38);
  return;
}

Assistant:

void RenX::ExemptionDatabase::process_data(Jupiter::DataBuffer &buffer, FILE *file, fpos_t pos) {
	std::unique_ptr<Entry> entry = std::make_unique<Entry>();
	entry->pos = pos;

	// Read data from buffer to entry
	entry->flags = buffer.pop<uint8_t>();
	entry->timestamp = std::chrono::system_clock::time_point(std::chrono::seconds(buffer.pop<uint64_t>()));
	entry->length = std::chrono::seconds(buffer.pop<int64_t>());
	entry->steamid = buffer.pop<uint64_t>();
	entry->ip = buffer.pop<uint32_t>();
	entry->prefix_length = buffer.pop<uint8_t>();
	entry->setter = buffer.pop<std::string>();

	m_entries.push_back(std::move(entry));
}